

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O1

uint32 __thiscall
google::protobuf::io::CodedInputStream::ReadTagFallback
          (CodedInputStream *this,uint32 first_byte_or_zero)

{
  uint8 *puVar1;
  long lVar2;
  uint8 *puVar3;
  uint8 uVar4;
  uint8 *puVar5;
  int iVar6;
  uint32 uVar8;
  uint uVar9;
  long lVar10;
  bool bVar11;
  pair<unsigned_long,_bool> pVar12;
  int iVar7;
  
  puVar5 = this->buffer_;
  iVar7 = (int)this->buffer_end_;
  iVar6 = iVar7 - (int)puVar5;
  if ((iVar6 < 10) && ((iVar6 < 1 || ((char)this->buffer_end_[-1] < '\0')))) {
    if ((iVar7 != (int)puVar5) ||
       (((this->buffer_size_after_limit_ < 1 && (this->total_bytes_read_ != this->current_limit_))
        || (this->total_bytes_limit_ <= this->total_bytes_read_ - this->buffer_size_after_limit_))))
    {
      if ((this->buffer_ != this->buffer_end_) || (bVar11 = Refresh(this), bVar11)) {
        puVar5 = this->buffer_;
        if ((puVar5 < this->buffer_end_) && (uVar4 = *puVar5, -1 < (long)(char)uVar4)) {
          this->buffer_ = puVar5 + 1;
          pVar12._8_8_ = 1;
          pVar12.first = (long)(char)uVar4;
        }
        else {
          pVar12 = ReadVarint64Fallback(this);
        }
        uVar8 = 0;
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          uVar8 = (uint32)pVar12.first;
        }
      }
      else {
        if (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_) {
          this->legitimate_message_end_ = true;
        }
        else {
          this->legitimate_message_end_ = this->current_limit_ == this->total_bytes_limit_;
        }
        uVar8 = 0;
      }
      return uVar8;
    }
    this->legitimate_message_end_ = true;
  }
  else if (first_byte_or_zero == 0) {
    this->buffer_ = puVar5 + 1;
  }
  else {
    uVar8 = ((uint)puVar5[1] * 0x80 + first_byte_or_zero) - 0x80;
    bVar11 = true;
    if ((char)puVar5[1] < '\0') {
      uVar8 = (uVar8 + (uint)puVar5[2] * 0x4000) - 0x4000;
      if ((char)puVar5[2] < '\0') {
        uVar8 = (uVar8 + (uint)puVar5[3] * 0x200000) - 0x200000;
        if ((char)puVar5[3] < '\0') {
          uVar8 = uVar8 + (uint)puVar5[4] * 0x10000000 + 0xf0000000;
          if ((char)puVar5[4] < '\0') {
            puVar1 = puVar5 + 6;
            if ((char)puVar5[5] < '\0') {
              puVar5 = puVar5 + 10;
              lVar10 = 0;
              do {
                uVar9 = (uint)lVar10;
                if (uVar9 == 4) goto LAB_00273709;
                lVar2 = lVar10 + 1;
                puVar3 = puVar1 + lVar10;
                lVar10 = lVar2;
              } while ((char)*puVar3 < '\0');
              puVar5 = puVar1 + lVar2;
LAB_00273709:
              bVar11 = 3 < uVar9;
            }
            else {
              bVar11 = false;
              puVar5 = puVar1;
            }
            bVar11 = (bool)(bVar11 ^ 1);
          }
          else {
            puVar5 = puVar5 + 5;
          }
        }
        else {
          puVar5 = puVar5 + 4;
        }
      }
      else {
        puVar5 = puVar5 + 3;
      }
    }
    else {
      puVar5 = puVar5 + 2;
    }
    if (bVar11) {
      this->buffer_ = puVar5;
      return uVar8;
    }
  }
  return 0;
}

Assistant:

inline int CodedInputStream::BufferSize() const {
  return static_cast<int>(buffer_end_ - buffer_);
}